

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crypto_tests.cpp
# Opt level: O3

void __thiscall
crypto_tests::CryptoTest::TestHMACSHA512
          (CryptoTest *this,string *hexkey,string *hexin,string *hexout)

{
  long in_FS_OFFSET;
  string_view hex_str;
  string_view hex_str_00;
  string_view hex_str_01;
  vector<unsigned_char,_std::allocator<unsigned_char>_> key;
  vector<unsigned_char,_std::allocator<unsigned_char>_> local_200;
  vector<unsigned_char,_std::allocator<unsigned_char>_> local_1e8;
  vector<unsigned_char,_std::allocator<unsigned_char>_> local_1d0;
  CHMAC_SHA512 local_1b8;
  long local_28;
  
  local_28 = *(long *)(in_FS_OFFSET + 0x28);
  hex_str._M_str = (hexkey->_M_dataplus)._M_p;
  hex_str._M_len = hexkey->_M_string_length;
  ParseHex<unsigned_char>(&local_1d0,hex_str);
  CHMAC_SHA512::CHMAC_SHA512
            (&local_1b8,
             local_1d0.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
             super__Vector_impl_data._M_start,
             (long)local_1d0.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                   _M_impl.super__Vector_impl_data._M_finish -
             (long)local_1d0.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                   _M_impl.super__Vector_impl_data._M_start);
  hex_str_00._M_str = (hexin->_M_dataplus)._M_p;
  hex_str_00._M_len = hexin->_M_string_length;
  ParseHex<unsigned_char>(&local_1e8,hex_str_00);
  hex_str_01._M_str = (hexout->_M_dataplus)._M_p;
  hex_str_01._M_len = hexout->_M_string_length;
  ParseHex<unsigned_char>(&local_200,hex_str_01);
  TestVector<CHMAC_SHA512,std::vector<unsigned_char,std::allocator<unsigned_char>>,std::vector<unsigned_char,std::allocator<unsigned_char>>>
            (this,&local_1b8,&local_1e8,&local_200);
  if (local_200.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_200.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                    _M_impl.super__Vector_impl_data._M_start,
                    (long)local_200.
                          super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_200.
                          super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  if (local_1e8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_1e8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                    _M_impl.super__Vector_impl_data._M_start,
                    (long)local_1e8.
                          super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_1e8.
                          super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  if (local_1d0.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_start != (uchar *)0x0) {
    operator_delete(local_1d0.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                    _M_impl.super__Vector_impl_data._M_start,
                    (long)local_1d0.
                          super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_1d0.
                          super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_28) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void TestHMACSHA512(const std::string &hexkey, const std::string &hexin, const std::string &hexout) {
    std::vector<unsigned char> key = ParseHex(hexkey);
    TestVector(CHMAC_SHA512(key.data(), key.size()), ParseHex(hexin), ParseHex(hexout));
}